

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O3

bool __thiscall
google::protobuf::anon_unknown_20::FieldIndexSorter::operator()
          (FieldIndexSorter *this,FieldDescriptor *left,FieldDescriptor *right)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  int iVar4;
  
  if (this[0x50] == (FieldIndexSorter)0x0) {
    plVar2 = (long *)(*(long *)(this + 0x58) + 0x30);
  }
  else if (*(long *)(this + 0x68) == 0) {
    plVar2 = (long *)(*(long *)(this + 0x30) + 0x98);
  }
  else {
    plVar2 = (long *)(*(long *)(this + 0x68) + 0x80);
  }
  if (left[0x50] == (FieldDescriptor)0x0) {
    plVar3 = (long *)(*(long *)(left + 0x58) + 0x30);
  }
  else if (*(long *)(left + 0x68) == 0) {
    plVar3 = (long *)(*(long *)(left + 0x30) + 0x98);
  }
  else {
    plVar3 = (long *)(*(long *)(left + 0x68) + 0x80);
  }
  iVar1 = (int)((ulong)((long)this - *plVar2) >> 3) * 0x3cf3cf3d;
  iVar4 = (int)((ulong)((long)left - *plVar3) >> 3);
  return SBORROW4(iVar1,iVar4 * 0x3cf3cf3d) != iVar1 + iVar4 * -0x3cf3cf3d < 0;
}

Assistant:

inline int FieldDescriptor::index() const {
  if (!is_extension_) {
    return static_cast<int>(this - containing_type()->fields_);
  } else if (extension_scope_ != NULL) {
    return static_cast<int>(this - extension_scope_->extensions_);
  } else {
    return static_cast<int>(this - file_->extensions_);
  }
}